

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

WeakArenaReference<Js::IDiagObjectModelWalkerBase> * __thiscall
Js::RecyclableProxyObjectDisplay::CreateWalker(RecyclableProxyObjectDisplay *this)

{
  ThreadContext *this_00;
  DebugManager *this_01;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar1;
  RecyclableProxyObjectWalker *this_02;
  HeapAllocator *alloc;
  WeakArenaReference<Js::IDiagObjectModelWalkerBase> *this_03;
  TrackAllocData local_88;
  code *local_60;
  undefined8 local_58;
  TrackAllocData local_50;
  RecyclableProxyObjectWalker *local_28;
  IDiagObjectModelWalkerBase *pOMWalker;
  ReferencedArenaAdapter *pRefArena;
  RecyclableProxyObjectDisplay *this_local;
  
  pRefArena = (ReferencedArenaAdapter *)this;
  this_00 = ScriptContext::GetThreadContext((this->super_RecyclableObjectDisplay).scriptContext);
  this_01 = ThreadContext::GetDebugManager(this_00);
  pOMWalker = (IDiagObjectModelWalkerBase *)DebugManager::GetDiagnosticArena(this_01);
  if ((ReferencedArenaAdapter *)pOMWalker == (ReferencedArenaAdapter *)0x0) {
    this_local = (RecyclableProxyObjectDisplay *)0x0;
  }
  else {
    pAVar1 = &Memory::ReferencedArenaAdapter::Arena((ReferencedArenaAdapter *)pOMWalker)->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_50,(type_info *)&RecyclableProxyObjectWalker::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
               ,0xe8d);
    pAVar1 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar1,&local_50);
    local_60 = Memory::ArenaAllocator::Alloc;
    local_58 = 0;
    this_02 = (RecyclableProxyObjectWalker *)
              new<Memory::ArenaAllocator>(0x38,(ArenaAllocator *)pAVar1,0x3f67b0);
    RecyclableProxyObjectWalker::RecyclableProxyObjectWalker
              (this_02,(this->super_RecyclableObjectDisplay).scriptContext,
               (this->super_RecyclableObjectDisplay).instance);
    local_28 = this_02;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_88,
               (type_info *)&Memory::WeakArenaReference<Js::IDiagObjectModelWalkerBase>::typeinfo,0,
               0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
               ,0xe8e);
    alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_88);
    this_03 = (WeakArenaReference<Js::IDiagObjectModelWalkerBase> *)
              new<Memory::HeapAllocator>(0x10,alloc,0x350bd0);
    Memory::WeakArenaReference<Js::IDiagObjectModelWalkerBase>::WeakArenaReference
              (this_03,(ReferencedArenaAdapter *)pOMWalker,(IDiagObjectModelWalkerBase *)local_28);
    this_local = (RecyclableProxyObjectDisplay *)this_03;
  }
  return (WeakArenaReference<Js::IDiagObjectModelWalkerBase> *)this_local;
}

Assistant:

WeakArenaReference<IDiagObjectModelWalkerBase>* RecyclableProxyObjectDisplay::CreateWalker()
    {
        ReferencedArenaAdapter* pRefArena = scriptContext->GetThreadContext()->GetDebugManager()->GetDiagnosticArena();
        if (pRefArena)
        {
            IDiagObjectModelWalkerBase* pOMWalker = Anew(pRefArena->Arena(), RecyclableProxyObjectWalker, scriptContext, instance);
            return HeapNew(WeakArenaReference<IDiagObjectModelWalkerBase>, pRefArena, pOMWalker);
        }
        return nullptr;
    }